

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O2

void aom_ssim_parms_8x8_c
               (uint8_t *s,int sp,uint8_t *r,int rp,uint32_t *sum_s,uint32_t *sum_r,
               uint32_t *sum_sq_s,uint32_t *sum_sq_r,uint32_t *sum_sxr)

{
  int iVar1;
  long lVar2;
  
  for (iVar1 = 0; iVar1 != 8; iVar1 = iVar1 + 1) {
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      *sum_s = *sum_s + (uint)s[lVar2];
      *sum_r = *sum_r + (uint)r[lVar2];
      *sum_sq_s = *sum_sq_s + (uint)s[lVar2] * (uint)s[lVar2];
      *sum_sq_r = *sum_sq_r + (uint)r[lVar2] * (uint)r[lVar2];
      *sum_sxr = *sum_sxr + (uint)r[lVar2] * (uint)s[lVar2];
    }
    s = s + sp;
    r = r + rp;
  }
  return;
}

Assistant:

void aom_ssim_parms_8x8_c(const uint8_t *s, int sp, const uint8_t *r, int rp,
                          uint32_t *sum_s, uint32_t *sum_r, uint32_t *sum_sq_s,
                          uint32_t *sum_sq_r, uint32_t *sum_sxr) {
  int i, j;
  for (i = 0; i < 8; i++, s += sp, r += rp) {
    for (j = 0; j < 8; j++) {
      *sum_s += s[j];
      *sum_r += r[j];
      *sum_sq_s += s[j] * s[j];
      *sum_sq_r += r[j] * r[j];
      *sum_sxr += s[j] * r[j];
    }
  }
}